

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS ref_cavity_validate(REF_CAVITY ref_cavity)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  REF_NODE pRVar4;
  REF_GLOB *pRVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  REF_INT *pRVar9;
  long lVar10;
  
  iVar1 = ref_cavity->node;
  if (-1 < (long)iVar1) {
    pRVar4 = ref_cavity->ref_grid->node;
    iVar2 = pRVar4->max;
    if ((iVar1 < iVar2) && (pRVar5 = pRVar4->global, -1 < pRVar5[iVar1])) {
      uVar3 = ref_cavity->surf_node;
      if (((ulong)uVar3 == 0xffffffff) ||
         (((-1 < (int)uVar3 && ((int)uVar3 < iVar2)) && (-1 < pRVar5[uVar3])))) {
        if (0 < (long)ref_cavity->maxface) {
          lVar7 = 0;
          pRVar9 = ref_cavity->f2n;
          do {
            if (ref_cavity->f2n[lVar7 * 3] != -1) {
              lVar10 = 0;
              do {
                iVar1 = pRVar9[lVar10];
                if ((((long)iVar1 < 0) || (iVar2 <= iVar1)) || (pRVar5[iVar1] < 0)) {
                  pcVar8 = "cavity face node not valid";
                  uVar6 = 0x8fa;
                  goto LAB_0015f7b1;
                }
                lVar10 = lVar10 + 1;
              } while (lVar10 != 3);
            }
            lVar7 = lVar7 + 1;
            pRVar9 = pRVar9 + 3;
          } while (lVar7 != ref_cavity->maxface);
        }
        if ((long)ref_cavity->maxseg < 1) {
          return 0;
        }
        lVar7 = 0;
        pRVar9 = ref_cavity->s2n;
        do {
          if (ref_cavity->s2n[lVar7 * 3] != -1) {
            lVar10 = 0;
            do {
              uVar3 = pRVar9[lVar10];
              if ((((long)(int)uVar3 < 0) || (iVar2 <= (int)uVar3)) || (pRVar5[(int)uVar3] < 0)) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x903,"ref_cavity_validate","cavity segment node not valid");
                printf("for node %d\n",(ulong)uVar3);
                return 1;
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 == 1);
          }
          lVar7 = lVar7 + 1;
          pRVar9 = pRVar9 + 3;
          if (lVar7 == ref_cavity->maxseg) {
            return 0;
          }
        } while( true );
      }
      pcVar8 = "cavity surf node not valid";
      uVar6 = 0x8f4;
      goto LAB_0015f7b1;
    }
  }
  pcVar8 = "cavity node not valid";
  uVar6 = 0x8f1;
LAB_0015f7b1:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",uVar6,
         "ref_cavity_validate",pcVar8);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_validate(REF_CAVITY ref_cavity) {
  REF_NODE ref_node = ref_grid_node(ref_cavity_grid(ref_cavity));
  REF_INT node;
  REF_INT face, face_node;
  REF_INT seg, seg_node;

  RAS(ref_node_valid(ref_node, ref_cavity_node(ref_cavity)),
      "cavity node not valid");
  if (REF_EMPTY != ref_cavity_surf_node(ref_cavity))
    RAS(ref_node_valid(ref_node, ref_cavity_surf_node(ref_cavity)),
        "cavity surf node not valid");

  each_ref_cavity_valid_face(ref_cavity, face) {
    ; /* semi to force format */
    each_ref_cavity_face_node(ref_cavity, face_node) {
      node = ref_cavity_f2n(ref_cavity, face_node, face);
      RAS(ref_node_valid(ref_node, node), "cavity face node not valid");
    }
  }